

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int spki_table_remove_entry(spki_table *spki_table,spki_record *spki_record)

{
  long lVar1;
  spki_update_fp p_Var2;
  tommy_uint32_t hash;
  void *pvVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  undefined8 *puVar9;
  long in_FS_OFFSET;
  byte bVar10;
  spki_record in_stack_fffffffffffffe88;
  key_entry entry;
  
  bVar10 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  entry.asn = spki_record->asn;
  entry.socket = spki_record->socket;
  entry.ski._0_8_ = *(undefined8 *)spki_record->ski;
  entry.ski._8_8_ = *(undefined8 *)(spki_record->ski + 8);
  entry.ski._16_4_ = *(undefined4 *)(spki_record->ski + 0x10);
  puVar7 = spki_record->spki;
  puVar8 = entry.spki;
  for (lVar5 = 0x5b; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + 1;
    puVar8 = puVar8 + 1;
  }
  hash = tommy_inthash_u32(entry.asn);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  pvVar3 = tommy_hashlin_search(&spki_table->hashtable,spki_table->cmp_fp,&entry,hash);
  if (pvVar3 == (void *)0x0) {
    iVar6 = -3;
  }
  else {
    pvVar3 = tommy_hashlin_remove(&spki_table->hashtable,spki_table->cmp_fp,&entry,hash);
    iVar6 = -1;
    if (pvVar3 != (void *)0x0) {
      pvVar4 = tommy_list_remove_existing(&spki_table->list,(tommy_node *)((long)pvVar3 + 0xa0));
      if (pvVar4 != (void *)0x0) {
        lrtr_free(pvVar3);
        p_Var2 = spki_table->update_fp;
        if (p_Var2 == (spki_update_fp)0x0) {
          iVar6 = 0;
        }
        else {
          puVar9 = (undefined8 *)&stack0xfffffffffffffe88;
          for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar9 = *(undefined8 *)spki_record->ski;
            spki_record = (spki_record *)((long)spki_record + (ulong)bVar10 * -0x10 + 8);
            puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
          }
          iVar6 = 0;
          (*p_Var2)(spki_table,in_stack_fffffffffffffe88,false);
        }
      }
    }
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_remove_entry(struct spki_table *spki_table, struct spki_record *spki_record)
{
	uint32_t hash;
	struct key_entry entry;
	struct key_entry *rmv_elem;
	int rtval = SPKI_ERROR;

	spki_record_to_key_entry(spki_record, &entry);
	hash = tommy_inthash_u32(spki_record->asn);

	pthread_rwlock_wrlock(&spki_table->lock);

	if (!tommy_hashlin_search(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash)) {
		rtval = SPKI_RECORD_NOT_FOUND;
	} else {
		/* Remove from hashtable and list */
		rmv_elem = tommy_hashlin_remove(&spki_table->hashtable, spki_table->cmp_fp, &entry, hash);
		if (rmv_elem && tommy_list_remove_existing(&spki_table->list, &rmv_elem->list_node)) {
			lrtr_free(rmv_elem);
			spki_table_notify_clients(spki_table, spki_record, false);
			rtval = SPKI_SUCCESS;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return rtval;
}